

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

size_t upb_Message_ExtensionCount(upb_Message *msg)

{
  _Bool _Var1;
  upb_Message *local_48;
  size_t count;
  uintptr_t iter;
  upb_MessageValue val;
  upb_MiniTableExtension *ext;
  upb_Message_Internal *in;
  upb_Message *msg_local;
  
  in = (upb_Message_Internal *)msg;
  ext = (upb_MiniTableExtension *)_upb_Message_GetInternal_dont_copy_me__upb_internal_use_only(msg);
  if (ext == (upb_MiniTableExtension *)0x0) {
    msg_local = (upb_Message *)0x0;
  }
  else {
    count = 0;
    local_48 = (upb_Message *)0x0;
    while( true ) {
      _Var1 = upb_Message_NextExtension
                        ((upb_Message *)in,(upb_MiniTableExtension **)&val.str_val.size,
                         (upb_MessageValue *)&iter,&count);
      if (!_Var1) break;
      local_48 = (upb_Message *)((long)&local_48->field_0 + 1);
    }
    msg_local = local_48;
  }
  return (size_t)msg_local;
}

Assistant:

size_t upb_Message_ExtensionCount(const upb_Message* msg) {
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  if (!in) return 0;
  const upb_MiniTableExtension* ext;
  upb_MessageValue val;
  uintptr_t iter = kUpb_Message_ExtensionBegin;
  size_t count = 0;
  while (upb_Message_NextExtension(msg, &ext, &val, &iter)) {
    count++;
  }
  return count;
}